

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O2

void * flatcc_builder_aligned_alloc(size_t alignment,size_t size)

{
  int iVar1;
  size_t __alignment;
  void *pvStack_10;
  
  pvStack_10 = (void *)0x0;
  __alignment = 8;
  if (8 < alignment) {
    __alignment = alignment;
  }
  iVar1 = posix_memalign(&pvStack_10,__alignment,size);
  if (pvStack_10 != (void *)0x0 && iVar1 != 0) {
    free(pvStack_10);
    pvStack_10 = (void *)0x0;
  }
  return pvStack_10;
}

Assistant:

void *flatcc_builder_aligned_alloc(size_t alignment, size_t size)
{
    return FLATCC_BUILDER_ALIGNED_ALLOC(alignment, size);
}